

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

char __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::GetCharacter(CordRepBtree *this,size_t offset)

{
  bool bVar1;
  char in_AL;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong index;
  ulong uVar5;
  uint uVar6;
  string_view sVar7;
  
  if ((this->super_CordRep).length <= offset) {
    __assert_fail("offset < length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3ea,"char absl::cord_internal::CordRepBtree::GetCharacter(size_t) const");
  }
  uVar6 = (uint)(this->super_CordRep).storage[0];
  do {
    if ((this->super_CordRep).length <= offset) {
      __assert_fail("offset < length",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x329,
                    "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                   );
    }
    uVar2 = (ulong)(this->super_CordRep).storage[1];
    uVar3 = this->edges_[uVar2]->length;
    index = uVar2;
    uVar4 = uVar2;
    uVar5 = offset;
    if (uVar3 <= offset) {
      do {
        uVar5 = uVar5 - uVar3;
        index = uVar4 + 1;
        uVar3 = this->edges_[uVar4 + 1]->length;
        uVar4 = index;
      } while (uVar3 <= uVar5);
    }
    if ((int)uVar6 < 1) {
      sVar7 = Data(this,index);
      in_AL = sVar7._M_str[uVar5];
    }
    else {
      if (index < uVar2) {
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((this->super_CordRep).storage[2] <= index) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      this = (CordRepBtree *)this->edges_[index];
      offset = uVar5;
      if ((this->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
    }
    bVar1 = (int)uVar6 < 1;
    uVar6 = uVar6 - 1;
    if (bVar1) {
      return in_AL;
    }
  } while( true );
}

Assistant:

char CordRepBtree::GetCharacter(size_t offset) const {
  assert(offset < length);
  const CordRepBtree* node = this;
  int height = node->height();
  for (;;) {
    Position front = node->IndexOf(offset);
    if (--height < 0) return node->Data(front.index)[front.n];
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}